

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::proximate(path *p,path *base,error_code *ec)

{
  path *in_RDI;
  error_code *in_stack_000000f0;
  path *in_stack_000000f8;
  path *in_stack_ffffffffffffffb0;
  path *in_stack_ffffffffffffffb8;
  
  weakly_canonical(in_stack_000000f8,in_stack_000000f0);
  weakly_canonical(in_stack_000000f8,in_stack_000000f0);
  path::lexically_proximate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  path::~path((path *)0x1db359);
  path::~path((path *)0x1db363);
  return in_RDI;
}

Assistant:

GHC_INLINE path proximate(const path& p, const path& base, std::error_code& ec)
{
    return weakly_canonical(p, ec).lexically_proximate(weakly_canonical(base, ec));
}